

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

void __thiscall
powerpc_test_cpu::test_instruction_CRI__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint a2;
  uint32_t a1;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (test_instruction_CRI__(char_const*,unsigned_int)::code == '\0') {
    test_instruction_CRI__();
  }
  iVar2 = 0;
  do {
    uVar1 = iVar2 * 0x800000 + (opcode & 0xfc7fffff);
    lVar3 = 0;
    do {
      a2 = imm_values[lVar3];
      opcode = a2 & 0xffff | uVar1 & 0xffff0000;
      test_instruction_CRI__::code[3] = a2 & 0xffff | uVar1 & 0xffe00000;
      lVar4 = 0;
      test_instruction_CRI__::code[0] = opcode;
      do {
        a1 = *(uint32_t *)((long)reg_values + lVar4);
        test_one(this,test_instruction_CRI__::code,insn,a1,a2,0,0);
        test_one(this,test_instruction_CRI__::code + 2,insn,a1,a2,0,0);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x90);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x24);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 8);
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_CRI__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_imm_values = sizeof(imm_values)/sizeof(imm_values[0]);

	for (int k = 0; k < 8; k++) {
		crfD_field::insert(opcode, k);
		for (int j = 0; j < n_imm_values; j++) {
			const uint32_t im = imm_values[j];
			UIMM_field::insert(opcode, im);
			code[0] = code[3] = opcode;			// <op> crfD,RA,SIMM
			rA_field::insert(code[3], 0);		// <op> crfD,R0,SIMM
			flush_icache_range(code, sizeof(code));
			for (int i = 0; i < n_reg_values; i++) {
				const uint32_t ra = reg_values[i];
				test_one(&code[0], insn, ra, im, 0);
				test_one(&code[2], insn, ra, im, 0);
			}
		}
	}
}